

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFramebufferDefaultStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::FramebufferSamplesTest::checkSet
          (FramebufferSamplesTest *this,ResultCollector *result,CallLogWrapper *gl)

{
  GLenum GVar1;
  
  glu::CallLogWrapper::glFramebufferParameteri(gl,0x8ca9,0x9313,1);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  glu::checkError(GVar1,"set state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFramebufferDefaultStateQueryTests.cpp"
                  ,0xa1);
  deqp::gls::StateQueryUtil::verifyStateFramebufferIntegerMin
            (result,gl,0x8ca9,0x9313,1,(this->super_FramebufferTest).m_verifier);
  glu::CallLogWrapper::glFramebufferParameteri(gl,0x8ca9,0x9313,0);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  glu::checkError(GVar1,"set state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFramebufferDefaultStateQueryTests.cpp"
                  ,0xa5);
  deqp::gls::StateQueryUtil::verifyStateFramebufferInteger
            (result,gl,0x8ca9,0x9313,0,(this->super_FramebufferTest).m_verifier);
  return;
}

Assistant:

void FramebufferSamplesTest::checkSet (tcu::ResultCollector& result, glu::CallLogWrapper& gl)
{
	gl.glFramebufferParameteri(GL_DRAW_FRAMEBUFFER, GL_FRAMEBUFFER_DEFAULT_SAMPLES, 1);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "set state");
	verifyStateFramebufferIntegerMin(result, gl, GL_DRAW_FRAMEBUFFER, GL_FRAMEBUFFER_DEFAULT_SAMPLES, 1, m_verifier);

	gl.glFramebufferParameteri(GL_DRAW_FRAMEBUFFER, GL_FRAMEBUFFER_DEFAULT_SAMPLES, 0);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "set state");
	verifyStateFramebufferInteger(result, gl, GL_DRAW_FRAMEBUFFER, GL_FRAMEBUFFER_DEFAULT_SAMPLES, 0, m_verifier);
}